

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Dictionary.cc
# Opt level: O2

QPDFObjectHandle __thiscall QPDFObjectHandle::getKey(QPDFObjectHandle *this,string *key)

{
  string *psVar1;
  size_type sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar3;
  Dictionary dict;
  allocator<char> local_79;
  string local_78;
  undefined1 local_50 [16];
  string local_40;
  
  as_dictionary((QPDFObjectHandle *)&local_78,(typed)key);
  if ((element_type *)local_78._M_dataplus._M_p == (element_type *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"returning null for attempted key retrieval",&local_79);
    typeWarning((QPDFObjectHandle *)key,"dictionary",&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_50,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key);
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_50 + 0x10),"",&local_79);
    QPDF_Null::create((QPDF_Null *)&local_78,(shared_ptr<QPDFObject> *)local_50,&getKey::msg,
                      (string *)(local_50 + 0x10));
    sVar2 = local_78._M_string_length;
    local_78._M_string_length = 0;
    (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_78._M_dataplus._M_p;
    (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2;
    local_78._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
    std::__cxx11::string::~string((string *)(local_50 + 0x10));
    psVar1 = (string *)local_50;
  }
  else {
    ::qpdf::BaseDictionary::getKey((BaseDictionary *)this,&local_78);
    psVar1 = &local_78;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar1->_M_string_length);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::getKey(std::string const& key) const
{
    if (auto dict = as_dictionary(strict)) {
        return dict.getKey(key);
    }
    typeWarning("dictionary", "returning null for attempted key retrieval");
    QTC::TC("qpdf", "QPDFObjectHandle dictionary null for getKey");
    static auto constexpr msg = " -> null returned from getting key $VD from non-Dictionary"sv;
    return QPDF_Null::create(obj, msg, "");
}